

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::InMemoryFile::WritableFileMappingImpl>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::InMemoryFile::WritableFileMappingImpl> *this,
          void *pointer)

{
  Mutex *this_00;
  int *piVar1;
  long lVar2;
  long *plVar3;
  
  if (pointer != (void *)0x0) {
    lVar2 = *(long *)((long)pointer + 0x10);
    this_00 = (Mutex *)(lVar2 + 0x18);
    Mutex::lock(this_00,EXCLUSIVE);
    piVar1 = (int *)(lVar2 + 0x60);
    *piVar1 = *piVar1 + -1;
    Mutex::unlock(this_00,EXCLUSIVE);
    plVar3 = *(long **)((long)pointer + 0x10);
    if (plVar3 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x10) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 8))
                (*(undefined8 **)((long)pointer + 8),(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    operator_delete(pointer,0x28);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }